

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot.cpp
# Opt level: O2

void save_image(string *filename,vector<PixelColor,_std::allocator<PixelColor>_> *image_data)

{
  uchar uVar1;
  uchar uVar2;
  pointer pPVar3;
  char cVar4;
  ostream *poVar5;
  runtime_error *this;
  pointer pPVar6;
  ofstream out;
  
  std::ofstream::ofstream(&out,(string *)filename,_S_bin);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 != '\0') {
    pPVar3 = (image_data->super__Vector_base<PixelColor,_std::allocator<PixelColor>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pPVar6 = (image_data->super__Vector_base<PixelColor,_std::allocator<PixelColor>_>)._M_impl.
                  super__Vector_impl_data._M_start; pPVar6 != pPVar3; pPVar6 = pPVar6 + 1) {
      uVar1 = pPVar6->g;
      uVar2 = pPVar6->b;
      poVar5 = std::operator<<((ostream *)&out,pPVar6->r);
      poVar5 = std::operator<<(poVar5,uVar1);
      std::operator<<(poVar5,uVar2);
    }
    std::ofstream::~ofstream(&out);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"unable to open output file");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void save_image(const std::string& filename, const std::vector<PixelColor>& image_data)
{
    std::ofstream out{filename, std::ofstream::binary};

    if (!out.is_open())
        throw std::runtime_error("unable to open output file");

    for (auto col : image_data)
        out << col.r << col.g << col.b;
}